

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# basic_streambuf.hpp
# Opt level: O0

int_type __thiscall
asio::basic_streambuf<std::allocator<char>_>::overflow
          (basic_streambuf<std::allocator<char>_> *this,int_type c)

{
  bool bVar1;
  char_type cVar2;
  long lVar3;
  long lVar4;
  ulong uVar5;
  char_type *pcVar6;
  size_t buffer_size;
  basic_streambuf<std::allocator<char>_> *pbStack_18;
  int_type c_local;
  basic_streambuf<std::allocator<char>_> *this_local;
  
  buffer_size._4_4_ = c;
  pbStack_18 = this;
  buffer_size._0_4_ = std::char_traits<char>::eof();
  bVar1 = std::char_traits<char>::eq_int_type
                    ((int_type *)((long)&buffer_size + 4),(int_type *)&buffer_size);
  if (((bVar1 ^ 0xffU) & 1) == 0) {
    this_local._4_4_ = std::char_traits<char>::not_eof((int_type *)((long)&buffer_size + 4));
  }
  else {
    lVar3 = std::streambuf::pptr();
    lVar4 = std::streambuf::epptr();
    if (lVar3 == lVar4) {
      lVar3 = std::streambuf::pptr();
      lVar4 = std::streambuf::gptr();
      uVar5 = lVar3 - lVar4;
      if ((uVar5 < this->max_size_) && (this->max_size_ - uVar5 < 0x80)) {
        reserve(this,this->max_size_ - uVar5);
      }
      else {
        reserve(this,0x80);
      }
    }
    cVar2 = std::char_traits<char>::to_char_type((int_type *)((long)&buffer_size + 4));
    pcVar6 = (char_type *)std::streambuf::pptr();
    *pcVar6 = cVar2;
    std::streambuf::pbump((int)this);
    this_local._4_4_ = buffer_size._4_4_;
  }
  return this_local._4_4_;
}

Assistant:

int_type overflow(int_type c)
  {
    if (!traits_type::eq_int_type(c, traits_type::eof()))
    {
      if (pptr() == epptr())
      {
        std::size_t buffer_size = pptr() - gptr();
        if (buffer_size < max_size_ && max_size_ - buffer_size < buffer_delta)
        {
          reserve(max_size_ - buffer_size);
        }
        else
        {
          reserve(buffer_delta);
        }
      }

      *pptr() = traits_type::to_char_type(c);
      pbump(1);
      return c;
    }

    return traits_type::not_eof(c);
  }